

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O1

bool Jinx::Impl::operator==(FunctionSignaturePart *left,FunctionSignaturePart *right)

{
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *pbVar1;
  pointer pbVar2;
  int iVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *this;
  pointer __str;
  bool bVar5;
  
  if (left->partType == right->partType) {
    bVar4 = true;
    if (left->partType == Name) {
      pbVar1 = (left->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this = (left->names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar4 = this != pbVar1, bVar4;
          this = this + 1) {
        pbVar2 = (right->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__str = (right->names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start; bVar5 = __str != pbVar2, bVar5;
            __str = __str + 1) {
          iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  compare(this,__str);
          if (iVar3 == 0) {
            if (bVar5) {
              return bVar4;
            }
            break;
          }
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline_t bool operator == (const FunctionSignaturePart & left, const FunctionSignaturePart & right)
	{
		// If the types are different, the parts aren't equal
		if (left.partType != right.partType)
			return false;

		// Check for any matches between the left and right sets of names.  We consider
		// the signature parts equal if there are any matches.
		if (left.partType == FunctionSignaturePartType::Name)
		{
			for (auto & leftName : left.names)
			{
				for (auto & rightName : right.names)
				{
					if (leftName == rightName)
						return true;
				}
			}
			return false;
		}
		return true;
	}